

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O1

shared_ptr<tchecker::typed_statement_t> __thiscall
tchecker::typecheck(tchecker *this,statement_t *stmt,integer_variables_t *localvars,
                   integer_variables_t *intvars,clock_variables_t *clocks,
                   function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *error)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<tchecker::typed_statement_t> sVar1;
  statement_typechecker_t v;
  _Any_data _Stack_138;
  code *local_128;
  statement_typechecker_t local_118;
  
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_138,error);
  details::statement_typechecker_t::statement_typechecker_t
            (&local_118,localvars,intvars,clocks,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&_Stack_138,&_Stack_138,__destroy_functor);
  }
  (*stmt->_vptr_statement_t[3])(stmt,&local_118);
  details::statement_typechecker_t::acquire_typed_statement((statement_typechecker_t *)this);
  details::statement_typechecker_t::~statement_typechecker_t(&local_118);
  sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tchecker::typed_statement_t>)
         sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_statement_t> typecheck(tchecker::statement_t const & stmt,
                                                       tchecker::integer_variables_t const & localvars,
                                                       tchecker::integer_variables_t const & intvars,
                                                       tchecker::clock_variables_t const & clocks,
                                                       std::function<void(std::string const &)> error)
{
  tchecker::details::statement_typechecker_t v(localvars, intvars, clocks, error);
  stmt.visit(v);
  return v.acquire_typed_statement();
}